

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::GLES2ThreadTest::DeleteShader::DeleteShader
          (DeleteShader *this,SharedPtr<deqp::egl::GLES2ThreadTest::Shader> *shader,bool useSync,
          bool serverSync)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_28;
  
  Operation::Operation(&this->super_Operation,"DeleteShader",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__DeleteShader_0210dba8;
  local_28.m_ptr = &shader->m_ptr->super_Object;
  (this->m_shader).m_ptr = (Shader *)local_28.m_ptr;
  pSVar2 = shader->m_state;
  (this->m_shader).m_state = pSVar2;
  if (pSVar2 == (SharedPtrStateBase *)0x0) {
    local_28.m_state = (SharedPtrStateBase *)0x0;
  }
  else {
    LOCK();
    pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar1 = &((this->m_shader).m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + 1;
    UNLOCK();
    local_28.m_ptr = &((this->m_shader).m_ptr)->super_Object;
    local_28.m_state = (this->m_shader).m_state;
    if (local_28.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_28.m_state)->strongRefCount = (local_28.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_28.m_state)->weakRefCount = (local_28.m_state)->weakRefCount + 1;
      UNLOCK();
    }
  }
  Operation::modifyGLObject(&this->super_Operation,&local_28);
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_28.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_28.m_ptr = (Object *)0x0;
      (*(local_28.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_28.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_28.m_state != (SharedPtrStateBase *)0x0)) {
      (*(local_28.m_state)->_vptr_SharedPtrStateBase[1])();
    }
  }
  return;
}

Assistant:

DeleteShader::DeleteShader (SharedPtr<Shader> shader, bool useSync, bool serverSync)
	: Operation	("DeleteShader", useSync, serverSync)
	, m_shader	(shader)
{
	modifyGLObject(SharedPtr<Object>(m_shader));
}